

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::PoissonRegressionLoss::forward_impl
          (PoissonRegressionLoss *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx)

{
  float __x;
  uint uVar1;
  undefined1 auVar2 [16];
  float fVar3;
  double dVar4;
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [16];
  undefined1 in_ZMM1 [64];
  
  auVar5 = in_ZMM1._0_16_;
  uVar1 = *this->pty;
  auVar2 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,uVar1 + 1);
  dVar4 = lgamma(auVar2._0_8_);
  __x = *(*(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
           _M_impl.super__Vector_impl_data._M_start)->v;
  fVar3 = expf(__x);
  auVar2 = vcvtusi2ss_avx512f(auVar5,uVar1);
  *fx->v = (float)(((double)fVar3 + dVar4) - (double)(auVar2._0_4_ * __x));
  return;
}

Assistant:

void PoissonRegressionLoss::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("PoissonRegressionLoss not yet implemented for CUDA");
#else
  const auto y = *pty;
  const auto z = lgamma(y + 1);
  const auto x = xs[0]->v[0];
  fx.v[0] = expf(x) + z - y * x;
#endif
}